

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O1

void exponentialTest(void)

{
  Model *this;
  System *s;
  System *t;
  long *plVar1;
  double dVar2;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  this = (Model *)Model::createModel();
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sys1","");
  s = (System *)(**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sys2","");
  t = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"exp","");
  Model::createFlow<FlowExp>(this,&local_50,s,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*(code *)**(undefined8 **)this)(this,0,100);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sys1","");
  plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_70);
  dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
  if (ABS(dVar2 + -36.6032) < 0.0001) {
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sys2","");
    plVar1 = (long *)(**(code **)(*(long *)this + 0x40))(this,local_70);
    dVar2 = (double)(**(code **)(*plVar1 + 8))(plVar1);
    if (ABS(dVar2 + -63.3968) < 0.0001) {
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      return;
    }
    __assert_fail("fabs(m->findSystem(\"sys2\")->getValue() - 63.3968) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0xe,"void exponentialTest()");
  }
  __assert_fail("fabs(m->findSystem(\"sys1\")->getValue() - 36.6032) < 0.0001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,0xd,"void exponentialTest()");
}

Assistant:

void exponentialTest() {
    auto *m = Model::createModel();
    auto *s1 = m->createSystem("sys1", 100.0);
    auto *s2 = m->createSystem("sys2", 0.0);
    m->createFlow<FlowExp>("exp", s1, s2);
    m->execute(0, 100);
    assert(fabs(m->findSystem("sys1")->getValue() - 36.6032) < 0.0001);
    assert(fabs(m->findSystem("sys2")->getValue() - 63.3968) < 0.0001);
}